

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iio.hpp
# Opt level: O2

void __thiscall mraa::Iio::writeFloat(Iio *this,string *attributeName,float value)

{
  int iVar1;
  ostream *poVar2;
  runtime_error *this_00;
  string local_1b0 [32];
  ostringstream oss;
  
  iVar1 = mraa_iio_write_float(this->m_iio,(attributeName->_M_dataplus)._M_p);
  if (iVar1 == 0) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar2 = std::operator<<((ostream *)&oss,"IIO writeFloat for attibute ");
  poVar2 = std::operator<<(poVar2,(string *)attributeName);
  std::operator<<(poVar2," failed");
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,local_1b0);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
    writeFloat(const std::string& attributeName, float value) const
    {
        mraa_result_t res = mraa_iio_write_float(m_iio, attributeName.c_str(), value);
        if (res != MRAA_SUCCESS) {
            std::ostringstream oss;
            oss << "IIO writeFloat for attibute " << attributeName << " failed";
            throw std::runtime_error(oss.str());
        }
    }